

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O2

Value<char> * __thiscall Qentem::Value<char>::operator=(Value<char> *this,uint num)

{
  reset(this);
  *(ulong *)&this->field_0 = (ulong)num;
  this->type_ = UIntLong;
  return this;
}

Assistant:

Value &operator=(Number_T num) noexcept {
        reset();
        number_ = num;

        if QENTEM_CONST_EXPRESSION (IsFloat<Number_T>()) {
            setTypeToDouble();
        } else if QENTEM_CONST_EXPRESSION (IsUnsigned<Number_T>()) {
            setTypeToUInt64();
        } else {
            setTypeToInt64();
        }